

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void denialofservice_tests::DoS_bantime_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  DoS_bantime t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1a8;
  std_string *in_stack_fffffffffffff1b0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1b8;
  DoS_bantime *in_stack_fffffffffffff1c8;
  const_string *in_stack_fffffffffffff1d0;
  const_string *msg;
  size_t in_stack_fffffffffffff1d8;
  size_t line_num;
  const_string *in_stack_fffffffffffff1e0;
  unit_test_log_t *in_stack_fffffffffffff1e8;
  DoS_bantime *in_stack_fffffffffffff2a8;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [1568];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [12])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  DoS_bantime::DoS_bantime(in_stack_fffffffffffff1c8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [12])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [16])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::setup_conditional<denialofservice_tests::DoS_bantime>((DoS_bantime *)0x5c3020);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [12])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  DoS_bantime::test_method(in_stack_fffffffffffff2a8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [12])in_stack_fffffffffffff1b0);
  this = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [19])in_stack_fffffffffffff1b0);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::teardown_conditional<denialofservice_tests::DoS_bantime>
            ((DoS_bantime *)0x5c3246);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  msg = local_c88;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [12])in_stack_fffffffffffff1b0);
  this_00 = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  DoS_bantime::~DoS_bantime((DoS_bantime *)in_stack_fffffffffffff1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_bantime)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<CConnman>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    banman->ClearBanned();
    int64_t nStartTime = GetTime();
    SetMockTime(nStartTime); // Overrides future calls to GetTime()

    CAddress addr(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode{id++,
                    /*sock=*/nullptr,
                    addr,
                    /*nKeyedNetGroupIn=*/4,
                    /*nLocalHostNonceIn=*/4,
                    CAddress(),
                    /*addrNameIn=*/"",
                    ConnectionType::INBOUND,
                    /*inbound_onion=*/false};
    dummyNode.SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(dummyNode, NODE_NETWORK);
    dummyNode.fSuccessfullyConnected = true;

    peerLogic->UnitTestMisbehaving(dummyNode.GetId());
    BOOST_CHECK(peerLogic->SendMessages(&dummyNode));
    BOOST_CHECK(banman->IsDiscouraged(addr));

    peerLogic->FinalizeNode(dummyNode);
}